

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O2

int32_t evutil_weakrand_range_(evutil_weakrand_state *state,int32_t top)

{
  int32_t iVar1;
  uint32_t uVar2;
  
  uVar2 = state->seed;
  do {
    uVar2 = uVar2 * 0x41c64e6d + 0x3039 & 0x7fffffff;
    iVar1 = (int32_t)((long)(ulong)uVar2 / (long)(int)(0x7fffffff / (long)top));
  } while (top <= iVar1);
  state->seed = uVar2;
  return iVar1;
}

Assistant:

ev_int32_t
evutil_weakrand_range_(struct evutil_weakrand_state *state, ev_int32_t top)
{
	ev_int32_t divisor, result;

	/* We can't just do weakrand() % top, since the low bits of the LCG
	 * are less random than the high ones.  (Specifically, since the LCG
	 * modulus is 2^N, every 2^m for m<N will divide the modulus, and so
	 * therefore the low m bits of the LCG will have period 2^m.) */
	divisor = EVUTIL_WEAKRAND_MAX / top;
	do {
		result = evutil_weakrand_(state) / divisor;
	} while (result >= top);
	return result;
}